

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatProviders.h
# Opt level: O1

void __thiscall
llvm::format_provider<llvm::iterator_range<llvm::StringRef_*>,_void>::format
          (format_provider<llvm::iterator_range<llvm::StringRef_*>,_void> *this,
          iterator_range<llvm::StringRef_*> *V,raw_ostream *Stream,StringRef Style)

{
  StringRef *pSVar1;
  StringRef Style_00;
  StringRef Style_01;
  StringRef Str;
  StringRef *V_00;
  StringRef Style_02;
  pair<llvm::StringRef,_llvm::StringRef> local_70;
  char *local_50;
  size_t local_48;
  char *local_40;
  size_t local_38;
  
  Style_02.Length = (size_t)Style.Data;
  Style_02.Data = (char *)Stream;
  parseOptions(&local_70,Style_02);
  local_40 = local_70.first.Data;
  local_38 = local_70.first.Length;
  Style_00.Length = local_70.second.Length;
  Style_00.Data = local_70.second.Data;
  V_00 = *(StringRef **)this;
  pSVar1 = *(StringRef **)(this + 8);
  if (V_00 != pSVar1) {
    format_provider<llvm::StringRef,_void>::format(V_00,(raw_ostream *)V,Style_00);
    V_00 = V_00 + 1;
  }
  Str.Length = local_38;
  Str.Data = local_40;
  local_48 = local_70.second.Length;
  local_50 = local_70.second.Data;
  for (; V_00 != pSVar1; V_00 = V_00 + 1) {
    raw_ostream::operator<<((raw_ostream *)V,Str);
    Style_01.Length = local_48;
    Style_01.Data = local_50;
    format_provider<llvm::StringRef,_void>::format(V_00,(raw_ostream *)V,Style_01);
  }
  return;
}

Assistant:

static void format(const llvm::iterator_range<IterT> &V,
                     llvm::raw_ostream &Stream, StringRef Style) {
    StringRef Sep;
    StringRef ArgStyle;
    std::tie(Sep, ArgStyle) = parseOptions(Style);
    auto Begin = V.begin();
    auto End = V.end();
    if (Begin != End) {
      auto Adapter =
          detail::build_format_adapter(std::forward<reference>(*Begin));
      Adapter.format(Stream, ArgStyle);
      ++Begin;
    }
    while (Begin != End) {
      Stream << Sep;
      auto Adapter =
          detail::build_format_adapter(std::forward<reference>(*Begin));
      Adapter.format(Stream, ArgStyle);
      ++Begin;
    }
  }